

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void flatbuffers::EnsureDirExists(string *filepath)

{
  long lVar1;
  char *__path;
  undefined1 local_30 [8];
  string parent;
  string *filepath_local;
  
  parent.field_2._8_8_ = filepath;
  StripFileName((string *)local_30,filepath);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    EnsureDirExists((string *)local_30);
  }
  __path = (char *)std::__cxx11::string::c_str();
  mkdir(__path,0x1e8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void EnsureDirExists(const std::string &filepath) {
  auto parent = StripFileName(filepath);
  if (parent.length()) EnsureDirExists(parent);
    // clang-format off

  #ifdef _WIN32
    (void)_mkdir(filepath.c_str());
  #else
    mkdir(filepath.c_str(), S_IRWXU|S_IRGRP|S_IXGRP);
  #endif
  // clang-format on
}